

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayCardsAction.cpp
# Opt level: O2

void __thiscall PlayCardsAction::inversePlayBy(PlayCardsAction *this,Player *p)

{
  CardGroup CStack_58;
  string local_38;
  
  CardGroup::CardGroup(&CStack_58,&this->cards);
  Player::addCards(p,&CStack_58);
  CardGroup::~CardGroup(&CStack_58);
  Player::getName_abi_cxx11_(&local_38,p);
  printf("PlayCardsAction: %s withdraw ",local_38._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_38);
  CardGroup::print(&this->cards);
  putchar(10);
  return;
}

Assistant:

void PlayCardsAction::inversePlayBy(Player* p) const {
        p->addCards(this->cards);
        printf("PlayCardsAction: %s withdraw ", p->getName().c_str());
        this->cards.print();
        puts("");
}